

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O2

SelectionSet * __thiscall
OpenMD::SelectionEvaluator::evaluate
          (SelectionSet *__return_storage_ptr__,SelectionEvaluator *this,int frame)

{
  SelectionSet bs;
  SelectionSet local_30;
  
  createSelectionSets(&local_30,this);
  if (this->isLoaded_ == true) {
    this->pc = 0;
    instructionDispatchLoop(this,&local_30,frame);
  }
  SelectionSet::parallelReduce(__return_storage_ptr__,&local_30);
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
            (&local_30.bitsets_);
  return __return_storage_ptr__;
}

Assistant:

SelectionSet SelectionEvaluator::evaluate(int frame) {
    SelectionSet bs = createSelectionSets();
    if (isLoaded_) {
      pc = 0;
      instructionDispatchLoop(bs, frame);
    }
    return bs.parallelReduce();
  }